

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O2

void ym2203_write(void *chip,UINT8 a,UINT8 v)

{
  FM_OPN *OPN;
  byte bVar1;
  code *UNRECOVERED_JUMPTABLE;
  undefined8 uVar2;
  
  OPN = (FM_OPN *)((long)chip + 0x108);
  if ((a & 1) == 0) {
    *(UINT8 *)((long)chip + 300) = v;
    if (0xf < v) {
      if ((byte)(v - 0x2d) < 3) {
        OPNPrescaler_w(OPN,(uint)v,1);
        return;
      }
      return;
    }
    UNRECOVERED_JUMPTABLE = *(code **)((long)chip + 0x560);
    uVar2 = *(undefined8 *)((long)chip + 0x578);
  }
  else {
    bVar1 = *(byte *)((long)chip + 300);
    *(UINT8 *)((long)chip + (ulong)bVar1 + 8) = v;
    if ((bVar1 & 0xf0) == 0x20) {
      ym2203_update_req(chip);
      OPNWriteMode(OPN,(uint)bVar1,(uint)v);
      return;
    }
    if ((bVar1 & 0xf0) != 0) {
      ym2203_update_req(chip);
      OPNWriteReg(OPN,(uint)bVar1,(uint)v);
      return;
    }
    UNRECOVERED_JUMPTABLE = *(code **)((long)chip + 0x560);
    uVar2 = *(undefined8 *)((long)chip + 0x578);
  }
  (*UNRECOVERED_JUMPTABLE)(uVar2,a,v);
  return;
}

Assistant:

void ym2203_write(void *chip,UINT8 a,UINT8 v)
{
	YM2203 *F2203 = (YM2203 *)chip;
	FM_OPN *OPN = &F2203->OPN;

	if( !(a&1) )
	{   /* address port */
		OPN->ST.address = v;

		/* Write register to SSG emulator */
		if( v < 16 ) OPN->ST.SSG_funcs.write(OPN->ST.SSG_param,a,v);

		/* prescaler select : 2d,2e,2f  */
		if( v >= 0x2d && v <= 0x2f )
			OPNPrescaler_w(OPN , v , 1);
	}
	else
	{   /* data port */
		UINT8 addr = OPN->ST.address;
		F2203->REGS[addr] = v;
		switch( addr & 0xf0 )
		{
		case 0x00:  /* 0x00-0x0f : SSG section */
			/* Write data to SSG emulator */
			OPN->ST.SSG_funcs.write(OPN->ST.SSG_param,a,v);
			break;
		case 0x20:  /* 0x20-0x2f : Mode section */
			ym2203_update_req(F2203);
			/* write register */
			OPNWriteMode(OPN,addr,v);
			break;
		default:    /* 0x30-0xff : OPN section */
			ym2203_update_req(F2203);
			/* write register */
			OPNWriteReg(OPN,addr,v);
		}
		FM_BUSY_SET(&OPN->ST,1);
	}
	//return OPN->ST.irq;
	return;
}